

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O2

ecs_table_t * find_or_create_table_exclude(ecs_world_t *world,ecs_table_t *node,ecs_entity_t remove)

{
  ecs_vector_t *vector;
  ecs_entity_t eVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  ecs_table_t *peVar5;
  ecs_world_t *world_00;
  int32_t iVar6;
  uint uVar7;
  void *pvVar8;
  ecs_table_t *node_00;
  ecs_edge_t *peVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ecs_entity_t aeStack_70 [2];
  ecs_entities_t local_60;
  ecs_entity_t *local_50;
  ecs_table_t *local_48;
  ecs_world_t *local_40;
  ecs_entity_t local_38;
  
  vector = node->type;
  aeStack_70[0] = 0x1254df;
  local_48 = node;
  local_40 = world;
  local_38 = remove;
  iVar6 = ecs_vector_count(vector);
  lVar4 = -((long)(iVar6 << 3) + 0xfU & 0xfffffffffffffff0);
  local_60.array = (ecs_entity_t *)((long)aeStack_70 + lVar4 + 8);
  local_50 = local_60.array;
  *(undefined8 *)((long)aeStack_70 + lVar4) = 0x125505;
  uVar7 = ecs_vector_count(vector);
  *(undefined8 *)((long)aeStack_70 + lVar4) = 8;
  uVar2 = *(undefined8 *)((long)aeStack_70 + lVar4);
  *(undefined8 *)((long)aeStack_70 + lVar4) = 0x10;
  uVar3 = *(undefined8 *)((long)aeStack_70 + lVar4);
  *(undefined8 *)((long)aeStack_70 + lVar4) = 0x125516;
  pvVar8 = _ecs_vector_first(vector,(ecs_size_t)uVar2,(int16_t)uVar3);
  uVar12 = 0;
  uVar10 = 0;
  if (0 < (int)uVar7) {
    uVar10 = (ulong)uVar7;
  }
  iVar11 = 0;
  do {
    world_00 = local_40;
    if (uVar10 == uVar12) {
      local_60.count = iVar11;
      *(undefined8 *)((long)aeStack_70 + lVar4) = 0x12558b;
      node_00 = ecs_table_find_or_create(world_00,&local_60);
      eVar1 = local_38;
      peVar5 = local_48;
      if (node_00 != local_48 && node_00 != (ecs_table_t *)0x0) {
        *(undefined8 *)((long)aeStack_70 + lVar4) = 0x1255ae;
        peVar9 = get_edge(node_00,eVar1);
        if (peVar9->add == (ecs_table_t *)0x0) {
          peVar9->add = peVar5;
        }
      }
      return node_00;
    }
    eVar1 = *(ecs_entity_t *)((long)pvVar8 + uVar12 * 8);
    if (eVar1 != local_38) {
      local_50[iVar11] = eVar1;
      *(undefined8 *)((long)aeStack_70 + lVar4) = 0xc;
      uVar2 = *(undefined8 *)((long)aeStack_70 + lVar4);
      *(undefined8 *)((long)aeStack_70 + lVar4) = 0x12556d;
      _ecs_assert(iVar11 < (int)uVar7,(int32_t)uVar2,(char *)0x0,"el <= count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x15c);
      if ((int)uVar7 <= iVar11) {
        *(code **)((long)aeStack_70 + lVar4) = ecs_table_traverse_add;
        __assert_fail("el <= count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                      ,0x15c,
                      "void remove_entity_from_type(ecs_type_t, ecs_entity_t, ecs_entities_t *)");
      }
      iVar11 = iVar11 + 1;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static
ecs_table_t *find_or_create_table_exclude(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entity_t remove)
{
    ecs_type_t type = node->type;
    int32_t count = ecs_vector_count(type);

    ecs_entities_t entities = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * count),
        .count = count
    };

    remove_entity_from_type(type, remove, &entities);

    ecs_table_t *result = ecs_table_find_or_create(world, &entities);
    if (!result) {
        return NULL;
    }

    if (result != node) {
        create_backlink_after_remove(result, node, remove);
    }

    return result;    
}